

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O0

uint64_t GET_64BIT_MSB_FIRST(void *vp)

{
  uint8_t *p;
  void *vp_local;
  
  return CONCAT17(*vp,CONCAT16(*(undefined1 *)((long)vp + 1),
                               CONCAT15(*(undefined1 *)((long)vp + 2),
                                        CONCAT14(*(undefined1 *)((long)vp + 3),
                                                 CONCAT13(*(undefined1 *)((long)vp + 4),
                                                          CONCAT12(*(undefined1 *)((long)vp + 5),
                                                                   CONCAT11(*(undefined1 *)
                                                                             ((long)vp + 6),
                                                                            *(undefined1 *)
                                                                             ((long)vp + 7))))))));
}

Assistant:

static inline uint64_t GET_64BIT_MSB_FIRST(const void *vp)
{
    const uint8_t *p = (const uint8_t *)vp;
    return (((uint64_t)p[7]      ) | ((uint64_t)p[6] <<  8) |
            ((uint64_t)p[5] << 16) | ((uint64_t)p[4] << 24) |
            ((uint64_t)p[3] << 32) | ((uint64_t)p[2] << 40) |
            ((uint64_t)p[1] << 48) | ((uint64_t)p[0] << 56));
}